

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3CodeRowTrigger
               (Parse *pParse,Trigger *pTrigger,int op,ExprList *pChanges,int tr_tm,Table *pTab,
               int reg,int orconf,int ignoreJump)

{
  undefined1 *puVar1;
  Returning *pRVar2;
  sqlite3 *db;
  Vdbe *p;
  ExprList *pEVar3;
  sqlite3 *db_00;
  char cVar4;
  int iVar5;
  Expr *pEVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  long in_FS_OFFSET;
  ExprList *local_198;
  int local_190;
  NameContext local_148;
  SrcList local_108;
  Select local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pTrigger != (Trigger *)0x0) {
    do {
      if ((((uint)pTrigger->op == op) && ((uint)pTrigger->tr_tm == tr_tm)) &&
         (iVar5 = checkColumnOverlap(pTrigger->pColumns,pChanges), iVar5 != 0)) {
        if (pTrigger->bReturning == '\0') {
          sqlite3CodeRowTriggerDirect(pParse,pTrigger,pTab,reg,orconf,ignoreJump);
        }
        else if (((pParse->pToplevel == (Parse *)0x0) && (pParse->bReturning != '\0')) &&
                (pRVar2 = (pParse->u1).pReturning, &pRVar2->retTrig == pTrigger)) {
          db = pParse->db;
          p = pParse->pVdbe;
          local_b8.pWin = (Window *)0x0;
          local_b8.pWinDefn = (Window *)0x0;
          local_b8.pLimit = (Expr *)0x0;
          local_b8.pWith = (With *)0x0;
          local_b8.pPrior = (Select *)0x0;
          local_b8.pNext = (Select *)0x0;
          local_b8.pHaving = (Expr *)0x0;
          local_b8.pOrderBy = (ExprList *)0x0;
          local_b8.pWhere = (Expr *)0x0;
          local_b8.pGroupBy = (ExprList *)0x0;
          local_b8.pEList = (ExprList *)0x0;
          local_b8.pSrc = (SrcList *)0x0;
          local_b8.selId = 0;
          local_b8.addrOpenEphm[0] = 0;
          local_b8.addrOpenEphm[1] = 0;
          local_b8._28_4_ = 0;
          local_b8.op = '\0';
          local_b8._1_1_ = 0;
          local_b8.nSelectRow = 0;
          local_b8.selFlags = 0;
          local_b8.iLimit = 0;
          local_b8.iOffset = 0;
          local_108.nSrc = 0;
          local_108.nAlloc = 0;
          local_108.a[0].zName = (char *)0x0;
          local_108.a[0].zAlias = (char *)0x0;
          local_108.a[0].pSTab = (Table *)0x0;
          local_108.a[0].fg = (anon_struct_4_19_bb8b771d_for_fg)0x0;
          local_108.a[0].iCursor = 0;
          local_108.a[0].colUsed = 0;
          local_108.a[0].u1.zIndexedBy = (char *)0x0;
          local_108.a[0].u2.pIBIndex = (Index *)0x0;
          local_108.a[0].u3.pOn = (Expr *)0x0;
          local_108.a[0].u4.pSchema = (Schema *)0x0;
          local_b8.pEList = sqlite3ExprListDup(db,pRVar2->pReturnEL,0);
          local_b8.pSrc = &local_108;
          local_108.nSrc = 1;
          local_108.a[0].zName = pTab->zName;
          local_108.a[0].iCursor = -1;
          local_108.a[0].pSTab = pTab;
          sqlite3SelectPrep(pParse,&local_b8,(NameContext *)0x0);
          if (pParse->nErr == 0) {
            sqlite3GenerateColumnNames(pParse,&local_b8);
          }
          if (local_b8.pEList != (ExprList *)0x0) {
            exprListDeleteNN(db,local_b8.pEList);
          }
          pEVar3 = pRVar2->pReturnEL;
          if (pEVar3->nExpr < 1) {
            local_198 = (ExprList *)0x0;
          }
          else {
            db_00 = pParse->db;
            lVar8 = 0;
            local_198 = (ExprList *)0x0;
            do {
              pEVar6 = pEVar3->a[lVar8].pExpr;
              if (pEVar6 != (Expr *)0x0) {
                if (pEVar6->op != 0xb4) {
                  if ((pEVar6->op != 0x8e) || (pEVar6->pRight->op != 0xb4)) {
                    pEVar6 = exprDup(db_00,pEVar6,0,(EdupBuf *)0x0);
                    local_198 = sqlite3ExprListAppend(pParse,local_198,pEVar6);
                    if ((db_00->mallocFailed == '\0') &&
                       (pcVar7 = pEVar3->a[lVar8].zEName, pcVar7 != (char *)0x0)) {
                      lVar9 = (long)local_198->nExpr;
                      pcVar7 = sqlite3DbStrDup(db_00,pcVar7);
                      local_198->a[lVar9 + -1].zEName = pcVar7;
                      *(ushort *)&local_198->a[lVar9 + -1].fg.field_0x1 =
                           *(ushort *)&local_198->a[lVar9 + -1].fg.field_0x1 & 0xfffc |
                           *(ushort *)&pEVar3->a[lVar8].fg.field_0x1 & 3;
                    }
                    goto LAB_001a465f;
                  }
                  sqlite3ErrorMsg(pParse,"RETURNING may not use \"TABLE.*\" wildcards");
                }
                if (0 < pTab->nCol) {
                  lVar11 = 0;
                  lVar9 = 0;
                  do {
                    if ((*(byte *)((long)&pTab->aCol->colFlags + lVar11) & 2) == 0) {
                      pEVar6 = sqlite3Expr(db_00,0x3c,
                                           *(char **)((long)&pTab->aCol->zCnName + lVar11));
                      local_198 = sqlite3ExprListAppend(pParse,local_198,pEVar6);
                      if (db_00->mallocFailed == '\0') {
                        iVar5 = local_198->nExpr;
                        pcVar7 = sqlite3DbStrDup(db_00,*(char **)((long)&pTab->aCol->zCnName +
                                                                 lVar11));
                        local_198->a[(long)iVar5 + -1].zEName = pcVar7;
                        puVar1 = &local_198->a[(long)iVar5 + -1].fg.field_0x1;
                        *puVar1 = *puVar1 & 0xfc;
                      }
                    }
                    lVar9 = lVar9 + 1;
                    lVar11 = lVar11 + 0x10;
                  } while (lVar9 < pTab->nCol);
                }
              }
LAB_001a465f:
              lVar8 = lVar8 + 1;
            } while (lVar8 < pEVar3->nExpr);
          }
          if (pParse->nErr == 0) {
            local_148.nRef = 0;
            local_148.nNcErr = 0;
            local_148.pNext = (NameContext *)0x0;
            local_148.pSrcList = (SrcList *)0x0;
            local_148.pWinSelect = (Select *)0x0;
            if (pRVar2->nRetCol == 0) {
              pRVar2->nRetCol = local_198->nExpr;
              iVar5 = pParse->nTab;
              pParse->nTab = iVar5 + 1;
              pRVar2->iRetCur = iVar5;
            }
            local_148.uNC._4_4_ = 0;
            local_148.uNC.iBaseReg = reg;
            local_148.ncFlags = 0x400;
            local_148.nNestedSelect = 0;
            pParse->eTriggerOp = pTrigger->op;
            pParse->pTriggerTab = pTab;
            local_148.pParse = pParse;
            iVar5 = sqlite3ResolveExprListNames(&local_148,local_198);
            if ((iVar5 == 0) && (db->mallocFailed == '\0')) {
              local_190 = local_198->nExpr;
              iVar5 = pParse->nMem + 1;
              sqlite3ProcessReturningSubqueries(local_198,pTab);
              pParse->nMem = pParse->nMem + local_190 + 2;
              pRVar2->iRetReg = iVar5;
              if ((long)local_190 < 1) {
                local_190 = 0;
              }
              else {
                lVar8 = 0;
                iVar10 = iVar5;
                do {
                  pEVar6 = *(Expr **)((long)&local_198->a[0].pExpr + lVar8);
                  sqlite3ExprCodeFactorable(pParse,pEVar6,iVar10);
                  cVar4 = sqlite3ExprAffinity(pEVar6);
                  if (cVar4 == 'E') {
                    sqlite3VdbeAddOp3(p,0x57,iVar10,0,0);
                  }
                  lVar8 = lVar8 + 0x18;
                  iVar10 = iVar10 + 1;
                } while ((long)local_190 * 0x18 != lVar8);
              }
              sqlite3VdbeAddOp3(p,0x61,iVar5,local_190,local_190 + iVar5);
              iVar10 = local_190 + iVar5 + 1;
              sqlite3VdbeAddOp3(p,0x7f,pRVar2->iRetCur,iVar10,0);
              sqlite3VdbeAddOp3(p,0x80,pRVar2->iRetCur,local_190 + iVar5,iVar10);
            }
          }
          if (local_198 != (ExprList *)0x0) {
            exprListDeleteNN(db,local_198);
          }
          pParse->eTriggerOp = '\0';
          pParse->pTriggerTab = (Table *)0x0;
        }
      }
      pTrigger = pTrigger->pNext;
    } while (pTrigger != (Trigger *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTrigger(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  int op,              /* One of TK_UPDATE, TK_INSERT, TK_DELETE */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int tr_tm,           /* One of TRIGGER_BEFORE, TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* The first in an array of registers (see above) */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Trigger *p;          /* Used to iterate through pTrigger list */

  assert( op==TK_UPDATE || op==TK_INSERT || op==TK_DELETE );
  assert( tr_tm==TRIGGER_BEFORE || tr_tm==TRIGGER_AFTER );
  assert( (op==TK_UPDATE)==(pChanges!=0) );

  for(p=pTrigger; p; p=p->pNext){

    /* Sanity checking:  The schema for the trigger and for the table are
    ** always defined.  The trigger must be in the same schema as the table
    ** or else it must be a TEMP trigger. */
    assert( p->pSchema!=0 );
    assert( p->pTabSchema!=0 );
    assert( p->pSchema==p->pTabSchema
         || p->pSchema==pParse->db->aDb[1].pSchema );

    /* Determine whether we should code this trigger.  One of two choices:
    **   1. The trigger is an exact match to the current DML statement
    **   2. This is a RETURNING trigger for INSERT but we are currently
    **      doing the UPDATE part of an UPSERT.
    */
    if( (p->op==op || (p->bReturning && p->op==TK_INSERT && op==TK_UPDATE))
     && p->tr_tm==tr_tm
     && checkColumnOverlap(p->pColumns, pChanges)
    ){
      if( !p->bReturning ){
        sqlite3CodeRowTriggerDirect(pParse, p, pTab, reg, orconf, ignoreJump);
      }else if( sqlite3IsToplevel(pParse) ){
        codeReturningTrigger(pParse, p, pTab, reg);
      }
    }
  }
}